

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_AddTxIn_RemoveTxIn_Test::TestBody
          (AbstractTransaction_AddTxIn_RemoveTxIn_Test *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  undefined4 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_2;
  uint32_t seq;
  uint32_t vout;
  uint32_t txin_count;
  AssertionResult gtest_ar;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> list;
  Transaction tx;
  undefined1 local_108 [32];
  Script local_e8;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 local_70 [16];
  Txid local_60 [2];
  
  local_a4 = 2;
  local_a8 = 0;
  local_ac = 0xffffffff;
  cfd::core::Transaction::Transaction((Transaction *)local_60,2,3);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6","");
      cfd::core::Txid::Txid((Txid *)local_108,(string *)&local_80);
      uVar2 = local_a8;
      uVar1 = local_ac;
      local_a0.data_ = (AssertHelperData *)local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
      cfd::core::Script::Script(&local_e8,(string *)&local_a0);
      cfd::core::Transaction::AddTxIn(local_60,(uint)local_108,uVar2,(Script *)(ulong)uVar1);
      cfd::core::Script::~Script(&local_e8);
      if (local_a0.data_ != (AssertHelperData *)local_90) {
        operator_delete(local_a0.data_);
      }
      local_108._0_8_ = &PTR__Txid_004ccb78;
      if ((pointer)local_108._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._8_8_);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x6e,
               "Expected: tx.AddTxIn( Txid( \"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6\"), vout, seq, Script(\"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597","");
      cfd::core::Txid::Txid((Txid *)local_108,(string *)&local_80);
      uVar2 = local_a8;
      uVar1 = local_ac;
      cfd::core::Script::Script(&local_e8);
      cfd::core::Transaction::AddTxIn(local_60,(uint)local_108,uVar2,(Script *)(ulong)uVar1);
      cfd::core::Script::~Script(&local_e8);
      local_108._0_8_ = &PTR__Txid_004ccb78;
      if ((pointer)local_108._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._8_8_);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x75,
               "Expected: tx.AddTxIn( Txid( \"0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597\"), vout, seq, Script()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  cfd::core::Transaction::GetTxInList();
  cfd::core::Txid::Txid((Txid *)local_108,(Txid *)(local_80 + 8));
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a0,"list[0].GetTxid().GetHex().c_str()",
             "\"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6\"",
             (char *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script),
             "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  if ((pointer *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) !=
      (pointer *)
      ((long)&local_e8.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete((undefined1 *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script))
    ;
  }
  local_108._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_108._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._8_8_);
  }
  if (local_a0.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script(&local_e8,(Script *)(local_80 + 0x30));
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a0,"list[0].GetUnlockingScript().GetHex().c_str()",
             "\"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac\"",(char *)local_108._0_8_,
             "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  cfd::core::Script::~Script(&local_e8);
  if (local_a0.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108._0_4_ = *(undefined4 *)(local_80 + 0x28);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"list[0].GetVout()","vout",(uint *)local_108,&local_a8);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_108);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108._0_4_ = *(undefined4 *)(local_80 + 0x68);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"list[0].GetSequence()","seq",(uint *)local_108,&local_ac);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_108);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Transaction::GetTxInCount();
  local_108._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"tx.GetTxInCount()","txin_count",(uint *)local_108,&local_a4);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_108);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::core::Transaction::RemoveTxIn((uint)local_60);
  }
  testing::Message::Message((Message *)&local_e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_108,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x82,
             "Expected: tx.RemoveTxIn(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
  if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8))
                ();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::Transaction::RemoveTxIn((uint)local_60);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x84,"Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  local_a4 = local_a4 - 1;
  uVar4 = cfd::core::Transaction::GetTxInCount();
  local_108._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"tx.GetTxInCount()","txin_count",(uint *)local_108,&local_a4);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_108);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x86,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_80);
  cfd::core::Transaction::~Transaction((Transaction *)local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxIn_RemoveTxIn) {
  uint32_t txin_count = 2;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
          vout, seq,
          Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac")));

  // script is empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597"),
          vout, seq, Script()));

  std::vector<TxInReference> list = tx.GetTxInList();
  EXPECT_STREQ(
      list[0].GetTxid().GetHex().c_str(),
      "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  EXPECT_STREQ(list[0].GetUnlockingScript().GetHex().c_str(),
               "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  EXPECT_EQ(list[0].GetVout(), vout);
  EXPECT_EQ(list[0].GetSequence(), seq);
  EXPECT_EQ(tx.GetTxInCount(), txin_count);

  // index error
  EXPECT_THROW(tx.RemoveTxIn(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  txin_count--;
  EXPECT_EQ(tx.GetTxInCount(), txin_count);
}